

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execCmp<(moira::Instr)37,(moira::Mode)1,(moira::Size)4>(Moira *this,u16 opcode)

{
  uint uVar1;
  uint uVar2;
  u32 uVar3;
  long lVar4;
  
  uVar1 = *(uint *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x38);
  uVar2 = *(uint *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58);
  lVar4 = (ulong)uVar2 - (ulong)uVar1;
  (this->reg).sr.c = (bool)((byte)((ulong)lVar4 >> 0x20) & 1);
  (this->reg).sr.v = (int)(((uint)lVar4 ^ uVar2) & (uVar1 ^ uVar2)) < 0;
  (this->reg).sr.z = (uint)lVar4 == 0;
  (this->reg).sr.n = (bool)((byte)((ulong)lVar4 >> 0x18) >> 7);
  uVar3 = (this->reg).pc;
  (this->reg).pc0 = uVar3;
  (this->queue).ird = (this->queue).irc;
  uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar3 + 2);
  (this->queue).irc = (u16)uVar3;
  (*this->_vptr_Moira[0x19])(this,2);
  return;
}

Assistant:

void
Moira::execCmp(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;

    cmp<S>(data, readD<S>(dst));
    prefetch<POLLIPL>();

    if (S == Long) sync(2);
}